

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O2

_Bool netaddr_acl_check_accept(netaddr_acl *acl,netaddr *addr)

{
  _Bool _Var1;
  
  if ((acl->reject_first != true) ||
     (_Var1 = _is_in_array(acl->reject,acl->reject_count,addr), !_Var1)) {
    _Var1 = _is_in_array(acl->accept,acl->accept_count,addr);
    if (_Var1) {
      return true;
    }
    if ((acl->reject_first != false) ||
       (_Var1 = _is_in_array(acl->reject,acl->reject_count,addr), !_Var1)) {
      return acl->accept_default;
    }
  }
  return false;
}

Assistant:

bool
netaddr_acl_check_accept(const struct netaddr_acl *acl, const struct netaddr *addr) {
  if (acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  if (_is_in_array(acl->accept, acl->accept_count, addr)) {
    return true;
  }

  if (!acl->reject_first) {
    if (_is_in_array(acl->reject, acl->reject_count, addr)) {
      return false;
    }
  }

  return acl->accept_default;
}